

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O2

bool __thiscall QPDF::allowModifyAssembly(QPDF *this)

{
  bool bVar1;
  bool bVar2;
  int P;
  int R;
  uint local_8 [2];
  
  local_8[0] = 0;
  local_8[1] = 0;
  bVar1 = isEncrypted(this,(int *)(local_8 + 1),(int *)local_8);
  bVar2 = true;
  if (bVar1) {
    if ((int)local_8[1] < 3) {
      bVar2 = SUB41((local_8[0] & 8) >> 3,0);
    }
    else {
      bVar2 = (bool)((byte)(local_8[0] >> 10) & 1);
    }
  }
  return bVar2;
}

Assistant:

bool
QPDF::allowModifyAssembly()
{
    int R = 0;
    int P = 0;
    bool status = true;
    if (isEncrypted(R, P)) {
        if (R < 3) {
            status = is_bit_set(P, 4);
        } else {
            status = is_bit_set(P, 11);
        }
    }
    return status;
}